

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void __thiscall TokenFilter::handleToken(TokenFilter *this,Token *t)

{
  bool bVar1;
  long *local_b8 [2];
  long local_a8 [2];
  Token local_98 [8];
  long *local_90;
  long local_80 [2];
  long *local_70;
  long local_60 [2];
  long *local_50;
  long local_40 [2];
  
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Potato","");
  QPDFTokenizer::Token::Token(local_98,tt_string,(string *)local_b8);
  bVar1 = QPDFTokenizer::Token::operator==(t,local_98);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  if (bVar1) {
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Salad","");
    QPDFTokenizer::Token::Token(local_98,tt_string,(string *)local_b8);
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
  }
  else {
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
  }
  return;
}

Assistant:

void
    handleToken(QPDFTokenizer::Token const& t) override
    {
        if (t == QPDFTokenizer::Token(QPDFTokenizer::tt_string, "Potato")) {
            // Exercise unparsing of strings by token constructor
            writeToken(QPDFTokenizer::Token(QPDFTokenizer::tt_string, "Salad"));
        } else {
            writeToken(t);
        }
    }